

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

CommandLine<Catch::ConfigData> * Catch::makeCommandLineParser(void)

{
  CommandLine<Catch::ConfigData> *in_RDI;
  allocator local_9c;
  allocator local_9b;
  allocator local_9a;
  allocator local_99;
  undefined1 local_98 [8];
  string local_90;
  string local_70 [32];
  undefined1 local_50 [32];
  _Alloc_hider local_30;
  
  Clara::CommandLine<Catch::ConfigData>::CommandLine(in_RDI);
  Clara::CommandLine<Catch::ConfigData>::bindProcessName<Catch::ConfigData,std::__cxx11::string>
            (in_RDI,0x68);
  std::__cxx11::string::string(local_70,"-?",&local_9b);
  Clara::CommandLine<Catch::ConfigData>::operator[]
            ((CommandLine<Catch::ConfigData> *)local_98,(string *)in_RDI);
  std::__cxx11::string::string((string *)(local_98 + 8),"-h",&local_9c);
  Clara::addOptName((Arg *)local_98,(string *)(local_98 + 8));
  std::__cxx11::string::string((string *)local_50,"--help",&local_99);
  Clara::addOptName((Arg *)local_98,(string *)local_50);
  std::__cxx11::string::string
            ((string *)&stack0xffffffffffffffd0,"display usage information",&local_9a);
  std::__cxx11::string::_M_assign((string *)((long)local_98 + 8));
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::bind<Catch::ConfigData>
            ((ArgBuilder *)local_98,7);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
  std::__cxx11::string::~string((string *)local_50);
  std::__cxx11::string::~string((string *)(local_98 + 8));
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::string(local_70,"-l",(allocator *)local_98);
  Clara::CommandLine<Catch::ConfigData>::operator[]
            ((CommandLine<Catch::ConfigData> *)&stack0xffffffffffffffd0,(string *)in_RDI);
  std::__cxx11::string::string((string *)(local_98 + 8),"--list-tests",&local_9b);
  Clara::addOptName((Arg *)local_30._M_p,(string *)(local_98 + 8));
  std::__cxx11::string::string((string *)local_50,"list all/matching test cases",&local_9c);
  std::__cxx11::string::_M_assign((string *)(local_30._M_p + 8));
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::bind<Catch::ConfigData>
            ((ArgBuilder *)&stack0xffffffffffffffd0,0);
  std::__cxx11::string::~string((string *)local_50);
  std::__cxx11::string::~string((string *)(local_98 + 8));
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::string(local_70,"-t",(allocator *)local_98);
  Clara::CommandLine<Catch::ConfigData>::operator[]
            ((CommandLine<Catch::ConfigData> *)&stack0xffffffffffffffd0,(string *)in_RDI);
  std::__cxx11::string::string((string *)(local_98 + 8),"--list-tags",&local_9b);
  Clara::addOptName((Arg *)local_30._M_p,(string *)(local_98 + 8));
  std::__cxx11::string::string((string *)local_50,"list all/matching tags",&local_9c);
  std::__cxx11::string::_M_assign((string *)(local_30._M_p + 8));
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::bind<Catch::ConfigData>
            ((ArgBuilder *)&stack0xffffffffffffffd0,1);
  std::__cxx11::string::~string((string *)local_50);
  std::__cxx11::string::~string((string *)(local_98 + 8));
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::string(local_70,"-s",(allocator *)local_98);
  Clara::CommandLine<Catch::ConfigData>::operator[]
            ((CommandLine<Catch::ConfigData> *)&stack0xffffffffffffffd0,(string *)in_RDI);
  std::__cxx11::string::string((string *)(local_98 + 8),"--success",&local_9b);
  Clara::addOptName((Arg *)local_30._M_p,(string *)(local_98 + 8));
  std::__cxx11::string::string((string *)local_50,"include successful tests in output",&local_9c);
  std::__cxx11::string::_M_assign((string *)(local_30._M_p + 8));
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::bind<Catch::ConfigData>
            ((ArgBuilder *)&stack0xffffffffffffffd0,4);
  std::__cxx11::string::~string((string *)local_50);
  std::__cxx11::string::~string((string *)(local_98 + 8));
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::string(local_70,"-b",(allocator *)local_98);
  Clara::CommandLine<Catch::ConfigData>::operator[]
            ((CommandLine<Catch::ConfigData> *)&stack0xffffffffffffffd0,(string *)in_RDI);
  std::__cxx11::string::string((string *)(local_98 + 8),"--break",&local_9b);
  Clara::addOptName((Arg *)local_30._M_p,(string *)(local_98 + 8));
  std::__cxx11::string::string((string *)local_50,"break into debugger on failure",&local_9c);
  std::__cxx11::string::_M_assign((string *)(local_30._M_p + 8));
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::bind<Catch::ConfigData>
            ((ArgBuilder *)&stack0xffffffffffffffd0,5);
  std::__cxx11::string::~string((string *)local_50);
  std::__cxx11::string::~string((string *)(local_98 + 8));
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::string(local_70,"-e",(allocator *)local_98);
  Clara::CommandLine<Catch::ConfigData>::operator[]
            ((CommandLine<Catch::ConfigData> *)&stack0xffffffffffffffd0,(string *)in_RDI);
  std::__cxx11::string::string((string *)(local_98 + 8),"--nothrow",&local_9b);
  Clara::addOptName((Arg *)local_30._M_p,(string *)(local_98 + 8));
  std::__cxx11::string::string((string *)local_50,"skip exception tests",&local_9c);
  std::__cxx11::string::_M_assign((string *)(local_30._M_p + 8));
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::bind<Catch::ConfigData>
            ((ArgBuilder *)&stack0xffffffffffffffd0,6);
  std::__cxx11::string::~string((string *)local_50);
  std::__cxx11::string::~string((string *)(local_98 + 8));
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::string(local_70,"-i",(allocator *)local_98);
  Clara::CommandLine<Catch::ConfigData>::operator[]
            ((CommandLine<Catch::ConfigData> *)&stack0xffffffffffffffd0,(string *)in_RDI);
  std::__cxx11::string::string((string *)(local_98 + 8),"--invisibles",&local_9b);
  Clara::addOptName((Arg *)local_30._M_p,(string *)(local_98 + 8));
  std::__cxx11::string::string((string *)local_50,"show invisibles (tabs, newlines)",&local_9c);
  std::__cxx11::string::_M_assign((string *)(local_30._M_p + 8));
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::bind<Catch::ConfigData>
            ((ArgBuilder *)&stack0xffffffffffffffd0,8);
  std::__cxx11::string::~string((string *)local_50);
  std::__cxx11::string::~string((string *)(local_98 + 8));
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::string(local_70,"-o",&local_9b);
  Clara::CommandLine<Catch::ConfigData>::operator[]
            ((CommandLine<Catch::ConfigData> *)local_98,(string *)in_RDI);
  std::__cxx11::string::string((string *)(local_98 + 8),"--out",&local_9c);
  Clara::addOptName((Arg *)local_98,(string *)(local_98 + 8));
  std::__cxx11::string::string((string *)local_50,"output filename",&local_99);
  std::__cxx11::string::_M_assign((string *)((long)local_98 + 8));
  std::__cxx11::string::string((string *)&stack0xffffffffffffffd0,"filename",&local_9a);
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::bind<Catch::ConfigData,std::__cxx11::string>
            ((ArgBuilder *)local_98,0x28,(string *)&stack0xffffffffffffffd0);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
  std::__cxx11::string::~string((string *)local_50);
  std::__cxx11::string::~string((string *)(local_98 + 8));
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::string(local_70,"-r",&local_9b);
  Clara::CommandLine<Catch::ConfigData>::operator[]
            ((CommandLine<Catch::ConfigData> *)local_98,(string *)in_RDI);
  std::__cxx11::string::string((string *)(local_98 + 8),"--reporter",&local_9c);
  Clara::addOptName((Arg *)local_98,(string *)(local_98 + 8));
  std::__cxx11::string::string((string *)local_50,"reporter to use (defaults to console)",&local_99)
  ;
  std::__cxx11::string::_M_assign((string *)((long)local_98 + 8));
  std::__cxx11::string::string((string *)&stack0xffffffffffffffd0,"name",&local_9a);
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::
  bind<Catch::ConfigData,std::__cxx11::string_const&>
            ((ArgBuilder *)local_98,addReporterName,(string *)&stack0xffffffffffffffd0);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
  std::__cxx11::string::~string((string *)local_50);
  std::__cxx11::string::~string((string *)(local_98 + 8));
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::string(local_70,"-n",&local_9b);
  Clara::CommandLine<Catch::ConfigData>::operator[]
            ((CommandLine<Catch::ConfigData> *)local_98,(string *)in_RDI);
  std::__cxx11::string::string((string *)(local_98 + 8),"--name",&local_9c);
  Clara::addOptName((Arg *)local_98,(string *)(local_98 + 8));
  std::__cxx11::string::string((string *)local_50,"suite name",&local_99);
  std::__cxx11::string::_M_assign((string *)((long)local_98 + 8));
  std::__cxx11::string::string((string *)&stack0xffffffffffffffd0,"name",&local_9a);
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::bind<Catch::ConfigData,std::__cxx11::string>
            ((ArgBuilder *)local_98,0x48,(string *)&stack0xffffffffffffffd0);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
  std::__cxx11::string::~string((string *)local_50);
  std::__cxx11::string::~string((string *)(local_98 + 8));
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::string(local_70,"-a",(allocator *)local_98);
  Clara::CommandLine<Catch::ConfigData>::operator[]
            ((CommandLine<Catch::ConfigData> *)&stack0xffffffffffffffd0,(string *)in_RDI);
  std::__cxx11::string::string((string *)(local_98 + 8),"--abort",&local_9b);
  Clara::addOptName((Arg *)local_30._M_p,(string *)(local_98 + 8));
  std::__cxx11::string::string((string *)local_50,"abort at first failure",&local_9c);
  std::__cxx11::string::_M_assign((string *)(local_30._M_p + 8));
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::bind<Catch::ConfigData>
            ((ArgBuilder *)&stack0xffffffffffffffd0,abortAfterFirst);
  std::__cxx11::string::~string((string *)local_50);
  std::__cxx11::string::~string((string *)(local_98 + 8));
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::string(local_70,"-x",&local_9b);
  Clara::CommandLine<Catch::ConfigData>::operator[]
            ((CommandLine<Catch::ConfigData> *)local_98,(string *)in_RDI);
  std::__cxx11::string::string((string *)(local_98 + 8),"--abortx",&local_9c);
  Clara::addOptName((Arg *)local_98,(string *)(local_98 + 8));
  std::__cxx11::string::string((string *)local_50,"abort after x failures",&local_99);
  std::__cxx11::string::_M_assign((string *)((long)local_98 + 8));
  std::__cxx11::string::string((string *)&stack0xffffffffffffffd0,"no. failures",&local_9a);
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::bind<Catch::ConfigData,int>
            ((ArgBuilder *)local_98,abortAfterX,(string *)&stack0xffffffffffffffd0);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
  std::__cxx11::string::~string((string *)local_50);
  std::__cxx11::string::~string((string *)(local_98 + 8));
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::string(local_70,"-w",&local_9b);
  Clara::CommandLine<Catch::ConfigData>::operator[]
            ((CommandLine<Catch::ConfigData> *)local_98,(string *)in_RDI);
  std::__cxx11::string::string((string *)(local_98 + 8),"--warn",&local_9c);
  Clara::addOptName((Arg *)local_98,(string *)(local_98 + 8));
  std::__cxx11::string::string((string *)local_50,"enable warnings",&local_99);
  std::__cxx11::string::_M_assign((string *)((long)local_98 + 8));
  std::__cxx11::string::string((string *)&stack0xffffffffffffffd0,"warning name",&local_9a);
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::
  bind<Catch::ConfigData,std::__cxx11::string_const&>
            ((ArgBuilder *)local_98,addWarning,(string *)&stack0xffffffffffffffd0);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
  std::__cxx11::string::~string((string *)local_50);
  std::__cxx11::string::~string((string *)(local_98 + 8));
  std::__cxx11::string::~string(local_70);
  local_50._0_8_ = Clara::CommandLine<Catch::ConfigData>::operator[]();
  std::__cxx11::string::string
            (local_70,"which test or tests to use",(allocator *)&stack0xffffffffffffffd0);
  std::__cxx11::string::_M_assign((string *)(local_50._0_8_ + 8));
  std::__cxx11::string::string
            ((string *)(local_98 + 8),"test name, pattern or tags",(allocator *)local_98);
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::
  bind<Catch::ConfigData,std::__cxx11::string_const&>
            ((ArgBuilder *)local_50,addTestOrTags,(string *)(local_98 + 8));
  std::__cxx11::string::~string((string *)(local_98 + 8));
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::string(local_70,"-d",&local_9b);
  Clara::CommandLine<Catch::ConfigData>::operator[]
            ((CommandLine<Catch::ConfigData> *)local_98,(string *)in_RDI);
  std::__cxx11::string::string((string *)(local_98 + 8),"--durations",&local_9c);
  Clara::addOptName((Arg *)local_98,(string *)(local_98 + 8));
  std::__cxx11::string::string((string *)local_50,"show test durations",&local_99);
  std::__cxx11::string::_M_assign((string *)((long)local_98 + 8));
  std::__cxx11::string::string((string *)&stack0xffffffffffffffd0,"yes|no",&local_9a);
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::bind<Catch::ConfigData,bool>
            ((ArgBuilder *)local_98,setShowDurations,(string *)&stack0xffffffffffffffd0);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
  std::__cxx11::string::~string((string *)local_50);
  std::__cxx11::string::~string((string *)(local_98 + 8));
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::string(local_70,"-f",&local_9b);
  Clara::CommandLine<Catch::ConfigData>::operator[]
            ((CommandLine<Catch::ConfigData> *)local_98,(string *)in_RDI);
  std::__cxx11::string::string((string *)(local_98 + 8),"--input-file",&local_9c);
  Clara::addOptName((Arg *)local_98,(string *)(local_98 + 8));
  std::__cxx11::string::string((string *)local_50,"load test names to run from a file",&local_99);
  std::__cxx11::string::_M_assign((string *)((long)local_98 + 8));
  std::__cxx11::string::string((string *)&stack0xffffffffffffffd0,"filename",&local_9a);
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::
  bind<Catch::ConfigData,std::__cxx11::string_const&>
            ((ArgBuilder *)local_98,loadTestNamesFromFile,(string *)&stack0xffffffffffffffd0);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
  std::__cxx11::string::~string((string *)local_50);
  std::__cxx11::string::~string((string *)(local_98 + 8));
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::string(local_70,"-#",(allocator *)local_98);
  Clara::CommandLine<Catch::ConfigData>::operator[]
            ((CommandLine<Catch::ConfigData> *)&stack0xffffffffffffffd0,(string *)in_RDI);
  std::__cxx11::string::string((string *)(local_98 + 8),"--filenames-as-tags",&local_9b);
  Clara::addOptName((Arg *)local_30._M_p,(string *)(local_98 + 8));
  std::__cxx11::string::string((string *)local_50,"adds a tag for the filename",&local_9c);
  std::__cxx11::string::_M_assign((string *)(local_30._M_p + 8));
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::bind<Catch::ConfigData>
            ((ArgBuilder *)&stack0xffffffffffffffd0,9);
  std::__cxx11::string::~string((string *)local_50);
  std::__cxx11::string::~string((string *)(local_98 + 8));
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::string
            (local_70,"--list-test-names-only",(allocator *)&stack0xffffffffffffffd0);
  Clara::CommandLine<Catch::ConfigData>::operator[]
            ((CommandLine<Catch::ConfigData> *)local_50,(string *)in_RDI);
  std::__cxx11::string::string
            ((string *)(local_98 + 8),"list all/matching test cases names only",
             (allocator *)local_98);
  std::__cxx11::string::_M_assign((string *)(local_50._0_8_ + 8));
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::bind<Catch::ConfigData>
            ((ArgBuilder *)local_50,3);
  std::__cxx11::string::~string((string *)(local_98 + 8));
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::string(local_70,"--list-reporters",(allocator *)&stack0xffffffffffffffd0);
  Clara::CommandLine<Catch::ConfigData>::operator[]
            ((CommandLine<Catch::ConfigData> *)local_50,(string *)in_RDI);
  std::__cxx11::string::string((string *)(local_98 + 8),"list all reporters",(allocator *)local_98);
  std::__cxx11::string::_M_assign((string *)(local_50._0_8_ + 8));
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::bind<Catch::ConfigData>
            ((ArgBuilder *)local_50,2);
  std::__cxx11::string::~string((string *)(local_98 + 8));
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::string(local_70,"--order",(allocator *)local_98);
  Clara::CommandLine<Catch::ConfigData>::operator[]
            ((CommandLine<Catch::ConfigData> *)&stack0xffffffffffffffd0,(string *)in_RDI);
  std::__cxx11::string::string
            ((string *)(local_98 + 8),"test case order (defaults to decl)",&local_9b);
  std::__cxx11::string::_M_assign((string *)(local_30._M_p + 8));
  std::__cxx11::string::string((string *)local_50,"decl|lex|rand",&local_9c);
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::
  bind<Catch::ConfigData,std::__cxx11::string_const&>
            ((ArgBuilder *)&stack0xffffffffffffffd0,setOrder,(string *)local_50);
  std::__cxx11::string::~string((string *)local_50);
  std::__cxx11::string::~string((string *)(local_98 + 8));
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::string(local_70,"--rng-seed",(allocator *)local_98);
  Clara::CommandLine<Catch::ConfigData>::operator[]
            ((CommandLine<Catch::ConfigData> *)&stack0xffffffffffffffd0,(string *)in_RDI);
  std::__cxx11::string::string
            ((string *)(local_98 + 8),"set a specific seed for random numbers",&local_9b);
  std::__cxx11::string::_M_assign((string *)(local_30._M_p + 8));
  std::__cxx11::string::string((string *)local_50,"\'time\'|number",&local_9c);
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::
  bind<Catch::ConfigData,std::__cxx11::string_const&>
            ((ArgBuilder *)&stack0xffffffffffffffd0,setRngSeed,(string *)local_50);
  std::__cxx11::string::~string((string *)local_50);
  std::__cxx11::string::~string((string *)(local_98 + 8));
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::string(local_70,"--force-colour",(allocator *)&stack0xffffffffffffffd0);
  Clara::CommandLine<Catch::ConfigData>::operator[]
            ((CommandLine<Catch::ConfigData> *)local_50,(string *)in_RDI);
  std::__cxx11::string::string
            ((string *)(local_98 + 8),"force colourised output (deprecated)",(allocator *)local_98);
  std::__cxx11::string::_M_assign((string *)(local_50._0_8_ + 8));
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::bind<Catch::ConfigData>
            ((ArgBuilder *)local_50,forceColour);
  std::__cxx11::string::~string((string *)(local_98 + 8));
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::string(local_70,"--use-colour",(allocator *)local_98);
  Clara::CommandLine<Catch::ConfigData>::operator[]
            ((CommandLine<Catch::ConfigData> *)&stack0xffffffffffffffd0,(string *)in_RDI);
  std::__cxx11::string::string((string *)(local_98 + 8),"should output be colourised",&local_9b);
  std::__cxx11::string::_M_assign((string *)(local_30._M_p + 8));
  std::__cxx11::string::string((string *)local_50,"yes|no",&local_9c);
  Clara::CommandLine<Catch::ConfigData>::ArgBuilder::
  bind<Catch::ConfigData,std::__cxx11::string_const&>
            ((ArgBuilder *)&stack0xffffffffffffffd0,setUseColour,(string *)local_50);
  std::__cxx11::string::~string((string *)local_50);
  std::__cxx11::string::~string((string *)(local_98 + 8));
  std::__cxx11::string::~string(local_70);
  return in_RDI;
}

Assistant:

inline Clara::CommandLine<ConfigData> makeCommandLineParser() {

        using namespace Clara;
        CommandLine<ConfigData> cli;

        cli.bindProcessName( &ConfigData::processName );

        cli["-?"]["-h"]["--help"]
            .describe( "display usage information" )
            .bind( &ConfigData::showHelp );

        cli["-l"]["--list-tests"]
            .describe( "list all/matching test cases" )
            .bind( &ConfigData::listTests );

        cli["-t"]["--list-tags"]
            .describe( "list all/matching tags" )
            .bind( &ConfigData::listTags );

        cli["-s"]["--success"]
            .describe( "include successful tests in output" )
            .bind( &ConfigData::showSuccessfulTests );

        cli["-b"]["--break"]
            .describe( "break into debugger on failure" )
            .bind( &ConfigData::shouldDebugBreak );

        cli["-e"]["--nothrow"]
            .describe( "skip exception tests" )
            .bind( &ConfigData::noThrow );

        cli["-i"]["--invisibles"]
            .describe( "show invisibles (tabs, newlines)" )
            .bind( &ConfigData::showInvisibles );

        cli["-o"]["--out"]
            .describe( "output filename" )
            .bind( &ConfigData::outputFilename, "filename" );

        cli["-r"]["--reporter"]
//            .placeholder( "name[:filename]" )
            .describe( "reporter to use (defaults to console)" )
            .bind( &addReporterName, "name" );

        cli["-n"]["--name"]
            .describe( "suite name" )
            .bind( &ConfigData::name, "name" );

        cli["-a"]["--abort"]
            .describe( "abort at first failure" )
            .bind( &abortAfterFirst );

        cli["-x"]["--abortx"]
            .describe( "abort after x failures" )
            .bind( &abortAfterX, "no. failures" );

        cli["-w"]["--warn"]
            .describe( "enable warnings" )
            .bind( &addWarning, "warning name" );

// - needs updating if reinstated
//        cli.into( &setVerbosity )
//            .describe( "level of verbosity (0=no output)" )
//            .shortOpt( "v")
//            .longOpt( "verbosity" )
//            .placeholder( "level" );

        cli[_]
            .describe( "which test or tests to use" )
            .bind( &addTestOrTags, "test name, pattern or tags" );

        cli["-d"]["--durations"]
            .describe( "show test durations" )
            .bind( &setShowDurations, "yes|no" );

        cli["-f"]["--input-file"]
            .describe( "load test names to run from a file" )
            .bind( &loadTestNamesFromFile, "filename" );

        cli["-#"]["--filenames-as-tags"]
            .describe( "adds a tag for the filename" )
            .bind( &ConfigData::filenamesAsTags );

        // Less common commands which don't have a short form
        cli["--list-test-names-only"]
            .describe( "list all/matching test cases names only" )
            .bind( &ConfigData::listTestNamesOnly );

        cli["--list-reporters"]
            .describe( "list all reporters" )
            .bind( &ConfigData::listReporters );

        cli["--order"]
            .describe( "test case order (defaults to decl)" )
            .bind( &setOrder, "decl|lex|rand" );

        cli["--rng-seed"]
            .describe( "set a specific seed for random numbers" )
            .bind( &setRngSeed, "'time'|number" );

        cli["--force-colour"]
            .describe( "force colourised output (deprecated)" )
            .bind( &forceColour );

        cli["--use-colour"]
            .describe( "should output be colourised" )
            .bind( &setUseColour, "yes|no" );

        return cli;
    }